

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt> *
__thiscall
pybind11::
class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>::
def_property_readonly<std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&(kratos::EventTracingStmt::*)()const>
          (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
           *this,char *name,offset_in_Var_to_subr *fget)

{
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  *pcVar1;
  return_value_policy local_49;
  offset_in_Var_to_subr local_48;
  void *local_38;
  offset_in_Var_to_subr local_30;
  cpp_function local_28;
  offset_in_Var_to_subr *local_20;
  offset_in_Var_to_subr *fget_local;
  char *name_local;
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  *this_local;
  
  local_38 = (void *)*fget;
  local_30 = fget[1];
  local_20 = fget;
  fget_local = (offset_in_Var_to_subr *)name;
  name_local = (char *)this;
  local_48 = _kratos__EventTracingStmt___pybind11__method_adaptor<kratos::EventTracingStmt,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&,kratos::EventTracingStmt>_std__map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const__kratos__EventTracingStmt______const__
                       (local_38,local_30);
  cpp_function::
  cpp_function<std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&,kratos::EventTracingStmt>
            (&local_28,local_48);
  local_49 = reference_internal;
  pcVar1 = class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
           ::def_property_readonly<pybind11::return_value_policy>
                     ((class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
                       *)this,name,&local_28,&local_49);
  cpp_function::~cpp_function(&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }